

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_chunk_test.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_0::CollectFieldsTest_SingleChunk_Test::
~CollectFieldsTest_SingleChunk_Test(CollectFieldsTest_SingleChunk_Test *this)

{
  CollectFieldsTest_SingleChunk_Test *this_local;
  
  ~CollectFieldsTest_SingleChunk_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(CollectFieldsTest, SingleChunk) {
  const char* field_names[] = {"repeated_int32", "optional_int32",
                               "optional_int64"};

  auto chunks = CreateAndCollectFields<TestAllTypes>(
      field_names, [](const FieldDescriptor* lhs, const FieldDescriptor* rhs) {
        return true;
      });

  EXPECT_EQ(chunks.size(), 1);
}